

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkCommsInterface.cpp
# Opt level: O1

void __thiscall
helics::NetworkCommsInterface::loadPortDefinitions(NetworkCommsInterface *this,ActionMessage *cmd)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  
  if ((cmd->messageAction == cmd_protocol) && (cmd->messageID == 0x5ab)) {
    LOCK();
    (this->PortNumber).super___atomic_base<int>._M_i = (cmd->dest_handle).hid;
    UNLOCK();
    if ((this->openPorts).startingPort < 0) {
      iVar1 = (this->PortNumber).super___atomic_base<int>._M_i;
      iVar4 = (*(this->super_CommsInterface)._vptr_CommsInterface[10])(this);
      iVar5 = (*(this->super_CommsInterface)._vptr_CommsInterface[10])(this);
      iVar2 = (this->PortNumber).super___atomic_base<int>._M_i;
      iVar6 = (*(this->super_CommsInterface)._vptr_CommsInterface[10])(this);
      iVar3 = iVar5 + 0x58;
      if (iVar4 + 100 <= iVar1) {
        iVar3 = iVar5 + -0x1ea;
      }
      (this->openPorts).startingPort = iVar3 + (iVar2 - iVar6) * 6;
    }
  }
  return;
}

Assistant:

void NetworkCommsInterface::loadPortDefinitions(const ActionMessage& cmd)
{
    if (cmd.action() == CMD_PROTOCOL) {
        if (cmd.messageID == PORT_DEFINITIONS) {
            PortNumber = cmd.getExtraData();
            if ((openPorts.getDefaultStartingPort() < 0)) {
                if (PortNumber < getDefaultBrokerPort() + 100) {
                    openPorts.setStartingPortNumber(getDefaultBrokerPort() + 100 +
                                                    (PortNumber - getDefaultBrokerPort() - 2) * 6);
                } else {
                    openPorts.setStartingPortNumber(getDefaultBrokerPort() + 110 +
                                                    (PortNumber - getDefaultBrokerPort() - 100) *
                                                        6);
                }
            }
        }
    }
}